

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QtPrivate::QColorLuminancePicker::setCol(QColorLuminancePicker *this,int h,int s)

{
  int in_ESI;
  QColorLuminancePicker *in_RDI;
  QColorLuminancePicker *unaff_retaddr;
  QColorLuminancePicker *pQVar1;
  
  pQVar1 = in_RDI;
  setCol(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_ESI);
  newHsv(in_RDI,(int)((ulong)pQVar1 >> 0x20),(int)pQVar1,in_ESI);
  return;
}

Assistant:

void QColorLuminancePicker::setCol(int h, int s)
{
    setCol(h, s, val);
    emit newHsv(h, s, val);
}